

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall
trento::DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus
          (DeformedWoodsSaxonNucleus *this,size_t A,double R,double a,double beta2,double beta4,
          double dmin)

{
  undefined8 *in_RDI;
  ulong in_XMM0_Qa;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double in_XMM1_Qa;
  undefined1 auVar3 [16];
  ulong in_XMM2_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  MinDistNucleus *in_XMM3_Qa;
  size_t in_XMM4_Qa;
  
  MinDistNucleus::MinDistNucleus(in_XMM3_Qa,in_XMM4_Qa,(double)in_RDI);
  *in_RDI = &PTR__DeformedWoodsSaxonNucleus_0016ca60;
  in_RDI[6] = in_XMM0_Qa;
  in_RDI[7] = in_XMM1_Qa;
  in_RDI[8] = in_XMM2_Qa;
  in_RDI[9] = in_XMM3_Qa;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_XMM2_Qa;
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar1 = vpand_avx(auVar1,auVar4);
  auVar4 = vfmadd213sd_fma(ZEXT816(0x3fe428f5c28f5c29),auVar1,ZEXT816(0x3ff0000000000000));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_XMM3_Qa;
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar1 = vpand_avx(auVar2,auVar5);
  auVar1 = vfmadd213sd_fma(ZEXT816(0x3feb333333333333),auVar1,auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_XMM1_Qa * 10.0;
  auVar1 = vfmadd213sd_fma(auVar1,auVar3,auVar6);
  in_RDI[10] = auVar1._0_8_;
  return;
}

Assistant:

DeformedWoodsSaxonNucleus::DeformedWoodsSaxonNucleus(
    std::size_t A, double R, double a, double beta2, double beta4, double dmin)
    : MinDistNucleus(A, dmin),
      R_(R),
      a_(a),
      beta2_(beta2),
      beta4_(beta4),
      rmax_(R*(1. + .63*std::fabs(beta2) + .85*std::fabs(beta4)) + 10.*a)
{}